

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O2

char * __thiscall (anonymous_namespace)::reader::gets_abi_cxx11_(reader *this,char *__s)

{
  int line;
  long in_RDX;
  char *str;
  long local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_48;
  
  if (in_RDX == -1) {
    str = "start != std::string::npos";
    line = 99;
  }
  else {
    local_70 = std::__cxx11::string::find(*(char **)__s,0x172da2);
    if (local_70 != -1) {
      local_70 = local_70 + 2;
      std::__cxx11::string::substr((ulong)&local_68,*(ulong *)__s);
      pstore::maybe<std::__cxx11::string,void>::maybe<std::__cxx11::string,void>
                ((maybe<std::__cxx11::string,void> *)&local_48,&local_68);
      pstore::error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>::
      error_or<unsigned_long,pstore::maybe<std::__cxx11::string,void>>
                ((error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>> *)
                 this,&local_70,&local_48);
      pstore::
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      reset(&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      return (char *)this;
    }
    str = "pos != std::string::npos";
    line = 0x65;
  }
  pstore::assert_failed
            (str,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
             ,line);
}

Assistant:

decltype (auto) gets (state_type const start) {
            using result_type = pstore::error_or_n<state_type, pstore::maybe<std::string>>;

            static auto const crlf = pstore::http::crlf;
            static auto const crlf_len = std::strlen (crlf);

            PSTORE_ASSERT (start != std::string::npos);
            auto const pos = src_.find (crlf, start);
            PSTORE_ASSERT (pos != std::string::npos);
            return result_type{pstore::in_place, pos + crlf_len,
                               pstore::just (src_.substr (start, pos - start))};
        }